

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O3

void WriteChipROM(CHIP_DEVICE *cDev,UINT8 memID,UINT32 memSize,UINT32 dataOfs,UINT32 dataLen,
                 UINT8 *data)

{
  DEVFUNC_WRITE_BLOCK UNRECOVERED_JUMPTABLE;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,memID) == 0) {
    if (cDev->romSize != (DEVFUNC_WRITE_MEMSIZE)0x0) {
      (*cDev->romSize)((cDev->base).defInf.dataPtr,memSize);
    }
    UNRECOVERED_JUMPTABLE = cDev->romWrite;
    if (dataLen == 0 || UNRECOVERED_JUMPTABLE == (DEVFUNC_WRITE_BLOCK)0x0) {
      return;
    }
  }
  else {
    if (cDev->romSizeB != (DEVFUNC_WRITE_MEMSIZE)0x0) {
      (*cDev->romSizeB)((cDev->base).defInf.dataPtr,memSize);
    }
    UNRECOVERED_JUMPTABLE = cDev->romWriteB;
    if (dataLen == 0 || UNRECOVERED_JUMPTABLE == (DEVFUNC_WRITE_BLOCK)0x0) {
      return;
    }
  }
  (*UNRECOVERED_JUMPTABLE)((cDev->base).defInf.dataPtr,dataOfs,dataLen,data);
  return;
}

Assistant:

static void WriteChipROM(VGMPlayer::CHIP_DEVICE* cDev, UINT8 memID,
						 UINT32 memSize, UINT32 dataOfs, UINT32 dataLen, const UINT8* data)
{
	if (memID == 0)
	{
		if (cDev->romSize != NULL)
			cDev->romSize(cDev->base.defInf.dataPtr, memSize);
		if (cDev->romWrite != NULL && dataLen)
			cDev->romWrite(cDev->base.defInf.dataPtr, dataOfs, dataLen, data);
	}
	else
	{
		if (cDev->romSizeB != NULL)
			cDev->romSizeB(cDev->base.defInf.dataPtr, memSize);
		if (cDev->romWriteB != NULL && dataLen)
			cDev->romWriteB(cDev->base.defInf.dataPtr, dataOfs, dataLen, data);
	}
	
	return;
}